

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XTemplateSerializer.cpp
# Opt level: O0

void xercesc_4_0::XTemplateSerializer::storeObject
               (RefVectorOf<xercesc_4_0::XMLNumber> *objToStore,XSerializeEngine *serEng)

{
  bool bVar1;
  XMLNumber *t;
  XSerializable *serObj;
  XMLNumber *data;
  XMLSize_t i;
  XMLSize_t vectorLength;
  XSerializeEngine *serEng_local;
  RefVectorOf<xercesc_4_0::XMLNumber> *objToStore_local;
  
  bVar1 = XSerializeEngine::needToStoreObject(serEng,objToStore);
  if (bVar1) {
    t = (XMLNumber *)
        BaseRefVectorOf<xercesc_4_0::XMLNumber>::size
                  (&objToStore->super_BaseRefVectorOf<xercesc_4_0::XMLNumber>);
    XSerializeEngine::writeSize(serEng,(XMLSize_t)t);
    for (data = (XMLNumber *)0x0; data < t;
        data = (XMLNumber *)((long)&(data->super_XSerializable)._vptr_XSerializable + 1)) {
      serObj = &BaseRefVectorOf<xercesc_4_0::XMLNumber>::elementAt
                          (&objToStore->super_BaseRefVectorOf<xercesc_4_0::XMLNumber>,
                           (XMLSize_t)data)->super_XSerializable;
      operator<<(serEng,serObj);
    }
  }
  return;
}

Assistant:

void XTemplateSerializer::storeObject(RefVectorOf<XMLNumber>* const objToStore
                                    , XSerializeEngine&             serEng)
{

    if (serEng.needToStoreObject(objToStore))
    {
        XMLSize_t vectorLength = objToStore->size();
        serEng.writeSize (vectorLength);

        for ( XMLSize_t i = 0; i < vectorLength; i++)
        {
            XMLNumber* data = objToStore->elementAt(i);
            serEng<<data;
        }
    }

}